

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::on_extended(bt_peer_connection *this,int received)

{
  _Atomic_word *p_Var1;
  crypto_receive_buffer *this_00;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  piece_index_t index;
  ulong uVar10;
  _List_node_base *p_Var11;
  bool bVar12;
  span<const_char> sVar13;
  error_code local_40;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  this_00 = &this->m_recv_buffer;
  iVar6 = crypto_receive_buffer::packet_size(this_00);
  if (iVar6 < 2) {
    local_40 = errors::make_error_code(invalid_extended);
    goto LAB_0018cc04;
  }
  p_Var3 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      UNLOCK();
      bVar12 = p_Var3->_M_use_count == 0;
      if (__libc_single_threaded != '\0') goto LAB_0018cbe1;
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar6 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
      bVar12 = p_Var3->_M_use_count == 0;
LAB_0018cbe1:
      iVar6 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
    }
    if (!bVar12) {
      sVar13 = crypto_receive_buffer::get(this_00);
      if ((int)sVar13.m_len < 2) {
        return;
      }
      uVar10 = (ulong)(byte)sVar13.m_ptr[1];
      pcVar9 = sVar13.m_ptr + 2;
      switch(uVar10) {
      case 0:
        on_extended_handshake(this);
        peer_connection::disconnect_if_redundant(&this->super_peer_connection);
        return;
      default:
        bVar12 = crypto_receive_buffer::packet_finished(this_00);
        if (bVar12) {
          uVar7 = crypto_receive_buffer::packet_size(this_00);
          peer_connection::peer_log
                    (&this->super_peer_connection,incoming_message,"EXTENSION_MESSAGE",
                     "msg: %d size: %d",uVar10,(ulong)uVar7);
        }
        plVar2 = &(this->super_peer_connection).m_extensions;
        p_Var11 = (_List_node_base *)plVar2;
        while (p_Var11 = (((_List_base<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                            *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var11 != (_List_node_base *)plVar2) {
          plVar4 = (long *)p_Var11[1]._M_next;
          iVar6 = crypto_receive_buffer::packet_size(this_00);
          cVar5 = (**(code **)(*plVar4 + 0x130))(plVar4,iVar6 + -2,uVar10,pcVar9,sVar13.m_len + -2);
          if (cVar5 != '\0') {
            return;
          }
        }
        local_40 = errors::make_error_code(invalid_message);
        goto LAB_0018cc04;
      case 3:
        bVar12 = crypto_receive_buffer::packet_finished(this_00);
        if (!bVar12) {
          return;
        }
        iVar6 = crypto_receive_buffer::packet_size(this_00);
        if (iVar6 == 3) {
          cVar5 = *pcVar9;
          pcVar9 = "false";
          if (cVar5 != '\0') {
            pcVar9 = "true";
          }
          peer_connection::peer_log
                    (&this->super_peer_connection,incoming_message,"UPLOAD_ONLY","%s",pcVar9);
          peer_connection::set_upload_only(&this->super_peer_connection,cVar5 != '\0');
          return;
        }
        uVar7 = crypto_receive_buffer::packet_size(this_00);
        pcVar9 = "UPLOAD_ONLY";
        break;
      case 4:
        bVar12 = crypto_receive_buffer::packet_finished(this_00);
        if (!bVar12) {
          return;
        }
        peer_connection::peer_log(&this->super_peer_connection,incoming_message,"HOLEPUNCH");
        on_holepunch(this);
        return;
      case 7:
        bVar12 = crypto_receive_buffer::packet_finished(this_00);
        if (!bVar12) {
          return;
        }
        iVar6 = crypto_receive_buffer::packet_size(this_00);
        if (iVar6 == 6) {
          index.m_val = 0;
          lVar8 = 0;
          do {
            index.m_val = index.m_val << 8 | (uint)(byte)pcVar9[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          peer_connection::incoming_dont_have(&this->super_peer_connection,index);
          return;
        }
        uVar7 = crypto_receive_buffer::packet_size(this_00);
        pcVar9 = "DONT_HAVE";
        break;
      case 8:
        bVar12 = crypto_receive_buffer::packet_finished(this_00);
        if (!bVar12) {
          return;
        }
        iVar6 = crypto_receive_buffer::packet_size(this_00);
        if (iVar6 == 3) {
          cVar5 = *pcVar9;
          pcVar9 = "false";
          if (cVar5 != '\0') {
            pcVar9 = "true";
          }
          peer_connection::peer_log
                    (&this->super_peer_connection,incoming_message,"SHARE_MODE","%s",pcVar9);
          peer_connection::set_share_mode(&this->super_peer_connection,cVar5 != '\0');
          return;
        }
        uVar7 = crypto_receive_buffer::packet_size(this_00);
        pcVar9 = "SHARE_MODE";
      }
      peer_connection::peer_log
                (&this->super_peer_connection,incoming_message,pcVar9,
                 "ERROR: unexpected packet size: %d",(ulong)uVar7);
      return;
    }
  }
  local_40 = errors::make_error_code(invalid_extended);
LAB_0018cc04:
  (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
            (this,&local_40,1,2);
  return;
}

Assistant:

void bt_peer_connection::on_extended(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);
		if (m_recv_buffer.packet_size() < 2)
		{
			disconnect(errors::invalid_extended, operation_t::bittorrent, peer_error);
			return;
		}

		if (associated_torrent().expired())
		{
			disconnect(errors::invalid_extended, operation_t::bittorrent, peer_error);
			return;
		}

		span<char const> recv_buffer = m_recv_buffer.get();
		if (int(recv_buffer.size()) < 2) return;

		TORRENT_ASSERT(recv_buffer.front() == msg_extended);
		recv_buffer = recv_buffer.subspan(1);

		int const extended_id = aux::read_uint8(recv_buffer);

		if (extended_id == 0)
		{
			on_extended_handshake();
			disconnect_if_redundant();
			return;
		}

		if (extended_id == upload_only_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
			if (m_recv_buffer.packet_size() != 3)
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "UPLOAD_ONLY"
					, "ERROR: unexpected packet size: %d", m_recv_buffer.packet_size());
#endif
				return;
			}
			bool const ul = aux::read_uint8(recv_buffer) != 0;
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "UPLOAD_ONLY"
				, "%s", (ul?"true":"false"));
#endif
			set_upload_only(ul);
			return;
		}

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (extended_id == share_mode_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
			if (m_recv_buffer.packet_size() != 3)
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "SHARE_MODE"
					, "ERROR: unexpected packet size: %d", m_recv_buffer.packet_size());
#endif
				return;
			}
			bool sm = aux::read_uint8(recv_buffer) != 0;
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "SHARE_MODE"
				, "%s", (sm?"true":"false"));
#endif
			set_share_mode(sm);
			return;
		}
#endif // TORRENT_DISABLE_SHARE_MODE

		if (extended_id == holepunch_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "HOLEPUNCH");
#endif
			on_holepunch();
			return;
		}

		if (extended_id == dont_have_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
			if (m_recv_buffer.packet_size() != 6)
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "DONT_HAVE"
					, "ERROR: unexpected packet size: %d", m_recv_buffer.packet_size());
#endif
				return;
			}
			piece_index_t const piece(aux::read_int32(recv_buffer));
			incoming_dont_have(piece);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (m_recv_buffer.packet_finished())
			peer_log(peer_log_alert::incoming_message, "EXTENSION_MESSAGE"
				, "msg: %d size: %d", extended_id, m_recv_buffer.packet_size());
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_extended(m_recv_buffer.packet_size() - 2, extended_id
				, recv_buffer))
				return;
		}
#endif

		disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
	}